

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-utils.h
# Opt level: O3

double tour_eval(Instance *instance,Tour *tour)

{
  uint uVar1;
  uint i;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double local_38;
  double dStack_30;
  double local_28;
  
  if (tour->num_comps != 1) {
    return INFINITY;
  }
  uVar1 = tour->num_customers;
  if (-1 < (int)uVar1) {
    lVar2 = 0;
    do {
      if (-1 < tour->succ[lVar2]) {
        if ((int)uVar1 < tour->succ[lVar2]) {
          return INFINITY;
        }
        if (tour->comp[lVar2] != 0) {
          return INFINITY;
        }
      }
      lVar2 = lVar2 + 1;
    } while ((ulong)uVar1 + 1 != lVar2);
    local_38 = *instance->demands + 0.0;
    dStack_30 = *instance->profits + 0.0;
    local_28 = 0.0;
    uVar3 = 0;
    do {
      i = (uint)uVar3;
      uVar1 = tour->succ[uVar3];
      lVar2 = (long)(int)uVar1;
      if (lVar2 == 0) {
        dVar4 = cptp_dist(instance,i,0);
        uVar3 = -(ulong)(instance->vehicle_cap < local_38);
        return (double)(uVar3 & 0x7ff0000000000000 |
                       ~uVar3 & (ulong)((local_28 + dVar4) - dStack_30));
      }
      if (uVar1 == i) {
        __assert_fail("next_vertex != curr_vertex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                      ,0x80,"double tour_eval(const Instance *, Tour *)");
      }
      dVar4 = cptp_dist(instance,i,uVar1);
      if ((int)uVar1 < 0) break;
      local_28 = local_28 + dVar4;
      local_38 = local_38 + instance->demands[lVar2];
      dStack_30 = dStack_30 + instance->profits[lVar2];
      uVar3 = (ulong)uVar1;
    } while ((int)uVar1 <= tour->num_customers);
  }
  __assert_fail("idx >= 0 && idx < len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/types.h"
                ,0x6c,"int32_t *veci32_access(int32_t *, int32_t, int32_t)");
}

Assistant:

static inline double tour_eval(const Instance *instance, Tour *tour) {
    if (tour->num_comps != 1) {
        return INFINITY;
    }

    for (int32_t i = 0; i < tour->num_customers + 1; i++) {
        int32_t succ = *tsucc(tour, i);
        if (succ >= 0) {
            if (*tcomp(tour, i) != 0 || succ >= tour->num_customers + 1) {
                return INFINITY;
            }
        }
    }

    double cost = 0.0;
    double profit = 0.0;
    double demands = 0.0;

    int32_t curr_vertex = 0;
    int32_t next_vertex = -1;

    profit += instance->profits[0];
    demands += instance->demands[0];

    while ((next_vertex = *tsucc(tour, curr_vertex)) != 0) {
        assert(next_vertex != curr_vertex);
        cost += cptp_dist(instance, curr_vertex, next_vertex);
        profit += instance->profits[next_vertex];
        demands += instance->demands[next_vertex];
        curr_vertex = next_vertex;
    }

    cost += cptp_dist(instance, curr_vertex, 0);

    if (demands > instance->vehicle_cap) {
        return INFINITY;
    } else {
        return cost - profit;
    }
}